

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode wc_statemach(connectdata *conn)

{
  void **ppvVar1;
  Curl_easy *pCVar2;
  curl_chunk_end_callback p_Var3;
  Curl_easy *pCVar4;
  curl_chunk_bgn_callback p_Var5;
  bool bVar6;
  CURLcode CVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  undefined8 *puVar11;
  ftp_parselist_data *pfVar12;
  
  do {
    pCVar2 = conn->data;
    switch((pCVar2->wildcard).state) {
    case CURLWC_INIT:
      pcVar8 = (pCVar2->state).path;
      pcVar10 = strrchr(pcVar8,0x2f);
      if (pcVar10 == (char *)0x0) {
        if (*pcVar8 == '\0') goto LAB_00535f57;
        pcVar10 = (*Curl_cstrdup)(pcVar8);
        (pCVar2->wildcard).pattern = pcVar10;
      }
      else {
        if (pcVar10[1] == '\0') {
LAB_00535f57:
          (pCVar2->wildcard).state = CURLWC_CLEAN;
          CVar7 = ftp_parse_url_path(conn);
          goto LAB_00535fcb;
        }
        pcVar8 = pcVar10 + 1;
        pcVar10 = (*Curl_cstrdup)(pcVar8);
        (pCVar2->wildcard).pattern = pcVar10;
      }
      if (pcVar10 != (char *)0x0) {
        *pcVar8 = '\0';
        puVar11 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
        if (puVar11 == (undefined8 *)0x0) {
          (*Curl_cfree)((pCVar2->wildcard).pattern);
          (pCVar2->wildcard).pattern = (char *)0x0;
        }
        else {
          pfVar12 = Curl_ftp_parselist_data_alloc();
          *puVar11 = pfVar12;
          if (pfVar12 == (ftp_parselist_data *)0x0) {
            (*Curl_cfree)((pCVar2->wildcard).pattern);
            (pCVar2->wildcard).pattern = (char *)0x0;
            (*Curl_cfree)(puVar11);
          }
          else {
            (pCVar2->wildcard).tmp = puVar11;
            (pCVar2->wildcard).tmp_dtor = wc_data_dtor;
            if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
              (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
            }
            ppvVar1 = &(pCVar2->wildcard).tmp;
            CVar7 = ftp_parse_url_path(conn);
            if (CVar7 != CURLE_OK) {
              (*Curl_cfree)((pCVar2->wildcard).pattern);
              (pCVar2->wildcard).pattern = (char *)0x0;
              (*(pCVar2->wildcard).tmp_dtor)((pCVar2->wildcard).tmp);
              *ppvVar1 = (void *)0x0;
              (pCVar2->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
              goto LAB_00535fcb;
            }
            pcVar8 = (*Curl_cstrdup)((conn->data->state).path);
            (pCVar2->wildcard).path = pcVar8;
            if (pcVar8 != (char *)0x0) {
              pCVar4 = conn->data;
              puVar11[1] = (pCVar4->set).fwrite_func;
              (pCVar4->set).fwrite_func = Curl_ftp_parselist;
              puVar11[2] = (pCVar4->set).out;
              (pCVar4->set).out = conn;
              CVar7 = CURLE_OK;
              Curl_infof(pCVar4,"Wildcard - Parsing started\n");
              goto LAB_00535fcb;
            }
            (*Curl_cfree)((pCVar2->wildcard).pattern);
            (pCVar2->wildcard).pattern = (char *)0x0;
            (*(pCVar2->wildcard).tmp_dtor)((pCVar2->wildcard).tmp);
            *ppvVar1 = (void *)0x0;
            (pCVar2->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
          }
        }
      }
      CVar7 = CURLE_OUT_OF_MEMORY;
LAB_00535fcb:
      if ((pCVar2->wildcard).state == CURLWC_CLEAN) {
        return CVar7;
      }
      (pCVar2->wildcard).state = (uint)(CVar7 != CURLE_OK) * 4 + CURLWC_MATCHING;
      return CVar7;
    case CURLWC_MATCHING:
      puVar11 = (undefined8 *)(pCVar2->wildcard).tmp;
      (pCVar2->set).fwrite_func = (curl_write_callback)puVar11[1];
      (pCVar2->set).out = (void *)puVar11[2];
      puVar11[1] = 0;
      puVar11[2] = 0;
      (pCVar2->wildcard).state = CURLWC_DOWNLOADING;
      CVar7 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar11);
      if (CVar7 == CURLE_OK) {
        if ((pCVar2->wildcard).filelist.size == 0) {
          (pCVar2->wildcard).state = CURLWC_CLEAN;
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else {
        (pCVar2->wildcard).state = CURLWC_CLEAN;
      }
      break;
    case CURLWC_DOWNLOADING:
      puVar11 = (undefined8 *)((pCVar2->wildcard).filelist.head)->ptr;
      pcVar8 = curl_maprintf("%s%s",(pCVar2->wildcard).path,*puVar11);
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)((conn->data->state).pathbuffer);
      pCVar4 = conn->data;
      (pCVar4->state).pathbuffer = pcVar8;
      (pCVar4->state).path = pcVar8;
      Curl_infof(pCVar4,"Wildcard - START of \"%s\"\n",*puVar11);
      p_Var5 = (conn->data->set).chunk_bgn;
      if (p_Var5 != (curl_chunk_bgn_callback)0x0) {
        lVar9 = (*p_Var5)(puVar11,(pCVar2->wildcard).customptr,(int)(pCVar2->wildcard).filelist.size
                         );
        if (lVar9 == 1) {
          pcVar8 = (char *)0x58;
          bVar6 = false;
        }
        else if (lVar9 == 2) {
          bVar6 = false;
          Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar11);
          (pCVar2->wildcard).state = CURLWC_SKIP;
          CVar7 = wc_statemach(conn);
          pcVar8 = (char *)(ulong)CVar7;
        }
        else {
          bVar6 = true;
        }
        if (!bVar6) {
          return (CURLcode)pcVar8;
        }
      }
      if (*(int *)(puVar11 + 1) == 0) {
        if ((*(byte *)(puVar11 + 0xc) & 0x40) != 0) {
          (conn->proto).ftpc.known_filesize = puVar11[5];
        }
        CVar7 = ftp_parse_url_path(conn);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        Curl_llist_remove(&(pCVar2->wildcard).filelist,(pCVar2->wildcard).filelist.head,(void *)0x0)
        ;
        if ((pCVar2->wildcard).filelist.size != 0) {
          return CURLE_OK;
        }
        (pCVar2->wildcard).state = CURLWC_CLEAN;
        return CURLE_OK;
      }
      (pCVar2->wildcard).state = CURLWC_SKIP;
      break;
    case CURLWC_CLEAN:
      puVar11 = (undefined8 *)(pCVar2->wildcard).tmp;
      CVar7 = CURLE_OK;
      if (puVar11 != (undefined8 *)0x0) {
        CVar7 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar11);
      }
      (pCVar2->wildcard).state = (CVar7 == CURLE_OK) + CURLWC_ERROR;
      return CVar7;
    case CURLWC_SKIP:
      p_Var3 = (pCVar2->set).chunk_end;
      if (p_Var3 != (curl_chunk_end_callback)0x0) {
        (*p_Var3)((pCVar2->wildcard).customptr);
      }
      Curl_llist_remove(&(pCVar2->wildcard).filelist,(pCVar2->wildcard).filelist.head,(void *)0x0);
      (pCVar2->wildcard).state = ((pCVar2->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
      break;
    default:
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode wc_statemach(struct connectdata *conn)
{
  struct WildcardData * const wildcard = &(conn->data->wildcard);
  CURLcode result = CURLE_OK;

  switch(wildcard->state) {
  case CURLWC_INIT:
    result = init_wc_data(conn);
    if(wildcard->state == CURLWC_CLEAN)
      /* only listing! */
      break;
    wildcard->state = result ? CURLWC_ERROR : CURLWC_MATCHING;
    break;

  case CURLWC_MATCHING: {
    /* In this state is LIST response successfully parsed, so lets restore
       previous WRITEFUNCTION callback and WRITEDATA pointer */
    struct ftp_wc_tmpdata *ftp_tmp = wildcard->tmp;
    conn->data->set.fwrite_func = ftp_tmp->backup.write_function;
    conn->data->set.out = ftp_tmp->backup.file_descriptor;
    ftp_tmp->backup.write_function = ZERO_NULL;
    ftp_tmp->backup.file_descriptor = NULL;
    wildcard->state = CURLWC_DOWNLOADING;

    if(Curl_ftp_parselist_geterror(ftp_tmp->parser)) {
      /* error found in LIST parsing */
      wildcard->state = CURLWC_CLEAN;
      return wc_statemach(conn);
    }
    if(wildcard->filelist.size == 0) {
      /* no corresponding file */
      wildcard->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    return wc_statemach(conn);
  }

  case CURLWC_DOWNLOADING: {
    /* filelist has at least one file, lets get first one */
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    struct curl_fileinfo *finfo = wildcard->filelist.head->ptr;

    char *tmp_path = aprintf("%s%s", wildcard->path, finfo->filename);
    if(!tmp_path)
      return CURLE_OUT_OF_MEMORY;

    /* switch default "state.pathbuffer" and tmp_path, good to see
       ftp_parse_url_path function to understand this trick */
    Curl_safefree(conn->data->state.pathbuffer);
    conn->data->state.pathbuffer = tmp_path;
    conn->data->state.path = tmp_path;

    infof(conn->data, "Wildcard - START of \"%s\"\n", finfo->filename);
    if(conn->data->set.chunk_bgn) {
      long userresponse = conn->data->set.chunk_bgn(
        finfo, wildcard->customptr, (int)wildcard->filelist.size);
      switch(userresponse) {
      case CURL_CHUNK_BGN_FUNC_SKIP:
        infof(conn->data, "Wildcard - \"%s\" skipped by user\n",
              finfo->filename);
        wildcard->state = CURLWC_SKIP;
        return wc_statemach(conn);
      case CURL_CHUNK_BGN_FUNC_FAIL:
        return CURLE_CHUNK_FAILED;
      }
    }

    if(finfo->filetype != CURLFILETYPE_FILE) {
      wildcard->state = CURLWC_SKIP;
      return wc_statemach(conn);
    }

    if(finfo->flags & CURLFINFOFLAG_KNOWN_SIZE)
      ftpc->known_filesize = finfo->size;

    result = ftp_parse_url_path(conn);
    if(result)
      return result;

    /* we don't need the Curl_fileinfo of first file anymore */
    Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);

    if(wildcard->filelist.size == 0) { /* remains only one file to down. */
      wildcard->state = CURLWC_CLEAN;
      /* after that will be ftp_do called once again and no transfer
         will be done because of CURLWC_CLEAN state */
      return CURLE_OK;
    }
  } break;

  case CURLWC_SKIP: {
    if(conn->data->set.chunk_end)
      conn->data->set.chunk_end(conn->data->wildcard.customptr);
    Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);
    wildcard->state = (wildcard->filelist.size == 0) ?
                      CURLWC_CLEAN : CURLWC_DOWNLOADING;
    return wc_statemach(conn);
  }

  case CURLWC_CLEAN: {
    struct ftp_wc_tmpdata *ftp_tmp = wildcard->tmp;
    result = CURLE_OK;
    if(ftp_tmp)
      result = Curl_ftp_parselist_geterror(ftp_tmp->parser);

    wildcard->state = result ? CURLWC_ERROR : CURLWC_DONE;
  } break;

  case CURLWC_DONE:
  case CURLWC_ERROR:
  case CURLWC_CLEAR:
    break;
  }

  return result;
}